

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_gnorm(double *c1,double *c2,int m,double g)

{
  int in_EDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double k;
  int local_14;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    dVar1 = in_XMM0_Qa * *in_RDI + 1.0;
    for (local_14 = in_EDX; 0 < local_14; local_14 = local_14 + -1) {
      in_RSI[local_14] = in_RDI[local_14] / dVar1;
    }
    dVar1 = pow(dVar1,1.0 / in_XMM0_Qa);
    *in_RSI = dVar1;
  }
  else {
    HTS_movem(in_RDI + 1,in_RSI + 1,in_EDX);
    dVar1 = exp(*in_RDI);
    *in_RSI = dVar1;
  }
  return;
}

Assistant:

static void HTS_gnorm(double *c1, double *c2, int m, const double g)
{
   double k;
   if (g != 0.0) {
      k = 1.0 + g * c1[0];
      for (; m >= 1; m--)
         c2[m] = c1[m] / k;
      c2[0] = pow(k, 1.0 / g);
   } else {
      HTS_movem(&c1[1], &c2[1], m);
      c2[0] = exp(c1[0]);
   }
}